

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::compare_types_cast<float,float>
               (_func_float_float *param_1,Function_Params *params,
               Type_Conversions_State *t_conversions)

{
  Boxed_Value *bv;
  bad_boxed_cast *anon_var_0;
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_float_float *param_0_local;
  
  bv = Function_Params::operator[](params,0);
  boxed_cast<float>(bv,t_conversions);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }